

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O2

ErrorStackOption *
ritobin::io::json_impl::json_value_impl<ritobin::I32,_(ritobin::Category)1>::from_json
          (ErrorStackOption *__return_storage_ptr__,I32 *value,json *json)

{
  int iVar1;
  undefined1 local_40 [16];
  _Alloc_hider local_30;
  size_type local_28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  if ((byte)(json->m_type - number_integer) < 3) {
    iVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::get<int,_int,_0>(json);
    value->value = iVar1;
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = false;
  }
  else {
    local_40._0_8_ = "i32";
    local_40._8_8_ = "json.is_number()";
    local_30._M_p = (pointer)&local_20;
    local_28 = 0;
    local_20._M_local_buf[0] = '\0';
    std::optional<ritobin::io::json_impl::ErrorStack>::
    optional<ritobin::io::json_impl::ErrorStack,_true>
              (__return_storage_ptr__,(ErrorStack *)local_40);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

static ErrorStackOption from_json(T& value, json const& json) noexcept {
            using value_t = std::remove_cvref_t<decltype(value.value)>;
            if constexpr (std::is_same_v<value_t, bool>) {
                bin_json_assert(json.is_boolean());
            } else {
                bin_json_assert(json.is_number());
            }
            value.value = json;
            return std::nullopt;
        }